

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Stats *stats)

{
  ostream *poVar1;
  Stats *stats_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"instrs(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->instrs);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"blocks(perfect: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->blocks).perfect);
  poVar1 = std::operator<<(poVar1,", conflicts: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->blocks).conflict);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"phantoms(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->phantoms);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"edges(internal(perfect: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->edges).internal.perfect);
  poVar1 = std::operator<<(poVar1,", conflicts: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->edges).internal.conflict);
  poVar1 = std::operator<<(poVar1,"), external(perfect: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->edges).external.perfect);
  poVar1 = std::operator<<(poVar1,", conflicts: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(stats->edges).external.conflict);
  poVar1 = std::operator<<(poVar1,")), ");
  poVar1 = std::operator<<(poVar1,"calls(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->calls);
  poVar1 = std::operator<<(poVar1,"), ");
  poVar1 = std::operator<<(poVar1,"indirects(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stats->indirects);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SpecificStrategy::Stats& stats) {
	os << "instrs(" << stats.instrs << "), "
		<< "blocks(perfect: " << stats.blocks.perfect
			<< ", conflicts: " << stats.blocks.conflict << "), "
		<< "phantoms(" << stats.phantoms << "), "
		<< "edges(internal(perfect: " << stats.edges.internal.perfect
			<< ", conflicts: " << stats.edges.internal.conflict
			<< "), external(perfect: " << stats.edges.external.perfect
			<< ", conflicts: " << stats.edges.external.conflict << ")), "
		<< "calls(" << stats.calls << "), "
		<< "indirects(" << stats.indirects << ")";
	return os;
}